

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_asn1.cc
# Opt level: O1

RSA * d2i_RSAPrivateKey(RSA **a,uchar **in,long len)

{
  RSA *pRVar1;
  CBS cbs;
  CBS local_28;
  
  if (-1 < len) {
    local_28.data = *in;
    local_28.len = len;
    pRVar1 = RSA_parse_private_key(&local_28);
    if (pRVar1 != (RSA *)0x0) {
      if (a != (RSA **)0x0) {
        RSA_free(*a);
        *a = (RSA *)pRVar1;
      }
      *in = local_28.data;
      return (RSA *)pRVar1;
    }
  }
  return (RSA *)0x0;
}

Assistant:

RSA *d2i_RSAPrivateKey(RSA **out, const uint8_t **inp, long len) {
  if (len < 0) {
    return NULL;
  }
  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  RSA *ret = RSA_parse_private_key(&cbs);
  if (ret == NULL) {
    return NULL;
  }
  if (out != NULL) {
    RSA_free(*out);
    *out = ret;
  }
  *inp = CBS_data(&cbs);
  return ret;
}